

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_command_line_params.cpp
# Opt level: O0

bool __thiscall
crnlib::command_line_params::parse
          (command_line_params *this,char *pCmd_line,uint n,param_desc *pParam_desc,
          bool skip_first_param)

{
  bool bVar1;
  undefined1 local_48 [8];
  dynamic_string_array p;
  bool skip_first_param_local;
  param_desc *pParam_desc_local;
  uint n_local;
  char *pCmd_line_local;
  command_line_params *this_local;
  
  p.m_capacity._3_1_ = skip_first_param;
  vector<crnlib::dynamic_string>::vector((vector<crnlib::dynamic_string> *)local_48);
  bVar1 = split_params(pCmd_line,(vector<crnlib::dynamic_string> *)local_48);
  if (bVar1) {
    bVar1 = vector<crnlib::dynamic_string>::empty((vector<crnlib::dynamic_string> *)local_48);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      if ((p.m_capacity._3_1_ & 1) != 0) {
        vector<crnlib::dynamic_string>::erase((vector<crnlib::dynamic_string> *)local_48,0);
      }
      this_local._7_1_ = parse(this,(dynamic_string_array *)local_48,n,pParam_desc);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  vector<crnlib::dynamic_string>::~vector((vector<crnlib::dynamic_string> *)local_48);
  return this_local._7_1_;
}

Assistant:

bool command_line_params::parse(const char* pCmd_line, uint n, const param_desc* pParam_desc, bool skip_first_param)
    {
        CRNLIB_ASSERT(n && pParam_desc);

        dynamic_string_array p;
        if (!split_params(pCmd_line, p))
        {
            return 0;
        }

        if (p.empty())
        {
            return 0;
        }

        if (skip_first_param)
        {
            p.erase(0U);
        }

        return parse(p, n, pParam_desc);
    }